

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::hashes_rejected(torrent *this,hash_request *req)

{
  bt_peer_connection *this_00;
  bool bVar1;
  int iVar2;
  pointer this_01;
  vector<peer_connection_*> *this_02;
  reference pppVar3;
  bt_peer_connection *btpeer;
  peer_connection *peer;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  hash_request *req_local;
  torrent *this_local;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_hash_picker);
  if (bVar1) {
    this_01 = ::std::
              unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_hash_picker);
    hash_picker::hashes_rejected(this_01,req);
    this_02 = &(this->super_torrent_hot_members).m_connections;
    __end2 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&this_02->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
    peer = (peer_connection *)
           ::std::
           vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ::end(&this_02->
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                       *)&peer), bVar1) {
      pppVar3 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end2);
      this_00 = (bt_peer_connection *)*pppVar3;
      iVar2 = (*(this_00->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[4])()
      ;
      if ((char)iVar2 == '\0') {
        bt_peer_connection::maybe_send_hash_request(this_00);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void torrent::hashes_rejected(hash_request const& req)
	{
		if (!m_hash_picker) return;
		m_hash_picker->hashes_rejected(req);
		// we need to poke all of the v2 peers in case there are no other
		// outstanding hash requests
		for (auto* peer : m_connections)
		{
			if (peer->type() != connection_type::bittorrent) continue;
			auto* const btpeer = static_cast<bt_peer_connection*>(peer);
			btpeer->maybe_send_hash_request();
		}
	}